

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBucket::VerifyMark(LargeHeapBucket *this)

{
  LargeHeapBlock *heapBlock_2;
  LargeHeapBlock *pLVar1;
  LargeHeapBlock *heapBlock;
  
  for (pLVar1 = this->largeBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next) {
    LargeHeapBlock::VerifyMark(pLVar1);
  }
  for (pLVar1 = this->fullLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0; pLVar1 = pLVar1->next) {
    LargeHeapBlock::VerifyMark(pLVar1);
  }
  for (pLVar1 = this->pendingDisposeLargeBlockList; pLVar1 != (LargeHeapBlock *)0x0;
      pLVar1 = pLVar1->next) {
    LargeHeapBlock::VerifyMark(pLVar1);
  }
  return;
}

Assistant:

void
LargeHeapBucket::VerifyMark()
{
    HeapBlockList::ForEach(largeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(fullLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
}